

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::LoginMessageTest_test_returns_formatted_string_Test::TestBody
          (LoginMessageTest_test_returns_formatted_string_Test *this)

{
  char *message;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  bidfx_public_api::price::pixie::LoginMessage::ToString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[178],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"Login(username=acozzoli, password=***, alias=nello, application=TradeSmart, version=3.7.0.88, api=Bidfx - C++, api_version=1.0, product=BidFXCpp, product_serial_number=29383BID)\""
             ,"login_message.ToString()",
             (char (*) [178])
             "Login(username=acozzoli, password=***, alias=nello, application=TradeSmart, version=3.7.0.88, api=Bidfx - C++, api_version=1.0, product=BidFXCpp, product_serial_number=29383BID)"
             ,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x8c,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(LoginMessageTest, test_returns_formatted_string)
{
    EXPECT_EQ("Login(username=acozzoli, password=***, alias=nello, application=TradeSmart, version=3.7.0.88, api=Bidfx - C++, api_version=1.0, product=BidFXCpp, product_serial_number=29383BID)",
                 login_message.ToString());
}